

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_table_insert(jit_State *J,RecordFFData *rd)

{
  uint *puVar1;
  TRef TVar2;
  TRef TVar3;
  MSize MVar4;
  GCtab *t;
  RecordIndex ix;
  TValue local_68;
  double local_60;
  uint local_38;
  TRef local_34;
  uint local_30;
  undefined4 local_24;
  
  puVar1 = J->base;
  local_38 = *puVar1;
  local_30 = puVar1[1];
  rd->nres = 0;
  if (local_30 != 0 && (local_38 & 0x1f000000) == 0xb000000) {
    if (puVar1[2] != 0) {
      recff_nyi(J,rd);
      return;
    }
    (J->fold).ins.field_0.op1 = (IRRef1)local_38;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x49137fff;
    TVar2 = lj_opt_fold(J);
    t = (GCtab *)(rd->argv->u64 & 0x7fffffffffff);
    TVar3 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    local_34 = lj_opt_fold(J);
    local_68.u64 = (ulong)t | 0xfffa000000000000;
    MVar4 = lj_tab_len(t);
    local_60 = (double)(int)(MVar4 + 1);
    local_24 = 0;
    lj_record_idx(J,(RecordIndex *)&local_68.gcr);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_insert(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  ix.val = J->base[1];
  rd->nres = 0;
  if (tref_istab(ix.tab) && ix.val) {
    if (!J->base[2]) {  /* Simple push: t[#t+1] = v */
      TRef trlen = emitir(IRTI(IR_ALEN), ix.tab, TREF_NIL);
      GCtab *t = tabV(&rd->argv[0]);
      ix.key = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
      settabV(J->L, &ix.tabv, t);
      setintV(&ix.keyv, lj_tab_len(t) + 1);
      ix.idxchain = 0;
      lj_record_idx(J, &ix);  /* Set new value. */
    } else {  /* Complex case: insert in the middle. */
      recff_nyiu(J, rd);
      return;
    }
  }  /* else: Interpreter will throw. */
}